

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SmallVector.h
# Opt level: O3

void __thiscall
slang::SmallVector<(anonymous_namespace)::Constructable,_2UL>::SmallVector
          (SmallVector<(anonymous_namespace)::Constructable,_2UL> *this,
          SmallVector<(anonymous_namespace)::Constructable,_2UL> *other)

{
  Constructable *first;
  
  (this->super_SmallVectorBase<(anonymous_namespace)::Constructable>).data_ =
       (pointer)(this->super_SmallVectorBase<(anonymous_namespace)::Constructable>).firstElement;
  (this->super_SmallVectorBase<(anonymous_namespace)::Constructable>).len = 0;
  (this->super_SmallVectorBase<(anonymous_namespace)::Constructable>).cap = 2;
  first = (other->super_SmallVectorBase<(anonymous_namespace)::Constructable>).data_;
  SmallVectorBase<(anonymous_namespace)::Constructable>::
  append<const_(anonymous_namespace)::Constructable_*>
            (&this->super_SmallVectorBase<(anonymous_namespace)::Constructable>,first,
             first + (other->super_SmallVectorBase<(anonymous_namespace)::Constructable>).len);
  return;
}

Assistant:

SmallVector(const SmallVector& other) : SmallVector(static_cast<const Base&>(other)) {}